

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O0

bool __thiscall USDFParser::Parse(USDFParser *this,int lumpnum,FileReader *lump,int lumplen)

{
  bool bVar1;
  int iVar2;
  char *buffer_00;
  char *name;
  FName *this_00;
  char *buffer;
  int lumplen_local;
  FileReader *lump_local;
  int lumpnum_local;
  USDFParser *this_local;
  
  buffer_00 = (char *)operator_new__((long)lumplen);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,buffer_00,(long)lumplen);
  name = FWadCollection::GetLumpFullName(&Wads,lumpnum);
  FScanner::OpenMem((FScanner *)this,name,buffer_00,lumplen);
  if (buffer_00 != (char *)0x0) {
    operator_delete__(buffer_00);
  }
  FScanner::SetCMode((FScanner *)this,true);
  bVar1 = FScanner::CheckString((FScanner *)this,"namespace");
  if (bVar1) {
    FScanner::MustGetToken((FScanner *)this,0x3d);
    FScanner::MustGetToken((FScanner *)this,0x102);
    this_00 = &(this->super_UDMFParserBase).namespc;
    FName::operator=(this_00,(this->super_UDMFParserBase).sc.String);
    iVar2 = FName::operator_cast_to_int(this_00);
    if (iVar2 == 0xb) {
      (this->super_UDMFParserBase).namespace_bits = 2;
    }
    else {
      if (iVar2 != 0x18c) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Unknown namespace %s. Ignoring dialogue lump.\n",
                   (this->super_UDMFParserBase).sc.String);
        return false;
      }
      (this->super_UDMFParserBase).namespace_bits = 1;
    }
    FScanner::MustGetToken((FScanner *)this,0x3b);
    do {
      while( true ) {
        bVar1 = FScanner::GetString((FScanner *)this);
        if (!bVar1) {
          return true;
        }
        bVar1 = FScanner::Compare((FScanner *)this,"conversation");
        if (bVar1) break;
        bVar1 = FScanner::Compare((FScanner *)this,"include");
        if (bVar1) {
          FScanner::MustGetToken((FScanner *)this,0x3d);
          FScanner::MustGetToken((FScanner *)this,0x102);
          LoadScriptFile((this->super_UDMFParserBase).sc.String,true,0);
          FScanner::MustGetToken((FScanner *)this,0x3b);
        }
        else {
          UDMFParserBase::Skip(&this->super_UDMFParserBase);
        }
      }
      FScanner::MustGetToken((FScanner *)this,0x7b);
      bVar1 = ParseConversation(this);
    } while (bVar1);
  }
  else {
    FScanner::ScriptMessage((FScanner *)this,"Map does not define a namespace.\n");
  }
  return false;
}

Assistant:

bool Parse(int lumpnum, FileReader *lump, int lumplen)
	{
		char *buffer = new char[lumplen];
		lump->Read(buffer, lumplen);
		sc.OpenMem(Wads.GetLumpFullName(lumpnum), buffer, lumplen);
		delete [] buffer;
		sc.SetCMode(true);
		// Namespace must be the first field because everything else depends on it.
		if (sc.CheckString("namespace"))
		{
			sc.MustGetToken('=');
			sc.MustGetToken(TK_StringConst);
			namespc = sc.String;
			switch(namespc)
			{
			case NAME_ZDoom:
				namespace_bits = Zd;
				break;
			case NAME_Strife:
				namespace_bits = St;
				break;
			default:
				sc.ScriptMessage("Unknown namespace %s. Ignoring dialogue lump.\n", sc.String);
				return false;
			}
			sc.MustGetToken(';');
		}
		else
		{
			sc.ScriptMessage("Map does not define a namespace.\n");
			return false;
		}

		while (sc.GetString())
		{
			if (sc.Compare("conversation"))
			{
				sc.MustGetToken('{');
				if (!ParseConversation()) return false;
			}
			else if (sc.Compare("include"))
			{
				sc.MustGetToken('=');
				sc.MustGetToken(TK_StringConst);
				LoadScriptFile(sc.String, true);
				sc.MustGetToken(';');
			}
			else
			{
				Skip();
			}
		}
		return true;
	}